

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_study.c
# Opt level: O3

int set_start_bits(pcre2_real_code_8 *re,PCRE2_SPTR8 code,BOOL utf)

{
  PCRE2_SPTR8 pPVar1;
  byte bVar2;
  uint8_t *puVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  byte bVar10;
  uint32_t c;
  long lVar11;
  ulong uVar12;
  BOOL BVar13;
  uint uVar14;
  uint32_t cvalue;
  byte *pbVar15;
  uint32_t *puVar16;
  uint table_limit;
  byte local_46 [6];
  PCRE2_SPTR8 pPStack_40;
  PCRE2_UCHAR8 buff [6];
  int local_34;
  ulong uVar17;
  
  table_limit = (uint)(utf == 0) * 0x10 + 0x10;
  uVar17 = (ulong)table_limit;
  bVar10 = *code;
  local_34 = 1;
  pPStack_40 = code;
LAB_0012ecab:
  pbVar15 = pPStack_40 + 3;
  if ((bVar10 - 0x86 < 7) && ((99U >> (bVar10 - 0x86 & 0x1f) & 1) != 0)) {
    pbVar15 = pPStack_40 + 5;
  }
LAB_0012ecd2:
  bVar10 = *pbVar15;
  iVar7 = 2;
  switch(bVar10) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x12:
  case 0x14:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x20:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x7d:
  case 0x88:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
    goto switchD_0012ecf0_caseD_79;
  case 4:
  case 5:
  case 0x57:
  case 0x58:
  case 0x5f:
    goto switchD_0012ecf0_caseD_4;
  case 6:
    puVar3 = re->tables;
    uVar12 = 0;
    do {
      re->start_bitmap[uVar12] = re->start_bitmap[uVar12] | ~puVar3[uVar12 + 0x240];
      uVar12 = uVar12 + 1;
    } while (uVar17 != uVar12);
    goto LAB_0012f176;
  case 7:
    iVar7 = 0x40;
    goto LAB_0012f18c;
  case 8:
    puVar3 = re->tables;
    uVar12 = 0;
    do {
      re->start_bitmap[uVar12] = re->start_bitmap[uVar12] | ~puVar3[uVar12 + 0x200];
      uVar12 = uVar12 + 1;
    } while (uVar17 != uVar12);
    goto LAB_0012f176;
  case 9:
    iVar7 = 0;
    goto LAB_0012f18c;
  case 10:
    puVar3 = re->tables;
    uVar12 = 0;
    do {
      re->start_bitmap[uVar12] = re->start_bitmap[uVar12] | ~puVar3[uVar12 + 0x2a0];
      uVar12 = uVar12 + 1;
    } while (uVar17 != uVar12);
LAB_0012f176:
    iVar7 = local_34;
    if (utf != 0) {
      re->start_bitmap[0x18] = 0xff;
      re->start_bitmap[0x19] = 0xff;
      re->start_bitmap[0x1a] = 0xff;
      re->start_bitmap[0x1b] = 0xff;
      re->start_bitmap[0x1c] = 0xff;
      re->start_bitmap[0x1d] = 0xff;
      re->start_bitmap[0x1e] = 0xff;
      re->start_bitmap[0x1f] = 0xff;
    }
    goto switchD_0012ecf0_caseD_78;
  case 0xb:
    iVar7 = 0xa0;
LAB_0012f18c:
    set_type_bits(re,iVar7,table_limit);
    iVar7 = local_34;
    goto switchD_0012ecf0_caseD_78;
  case 0x10:
    if (pbVar15[1] != 9) {
switchD_0012ecf0_caseD_79:
      return 0;
    }
    cvalue = _pcre2_ucd_caseless_sets_8[pbVar15[2]];
    iVar7 = local_34;
    if (cvalue != 0xffffffff) {
      puVar16 = _pcre2_ucd_caseless_sets_8 + pbVar15[2];
      goto LAB_0012f0ab;
    }
    goto switchD_0012ecf0_caseD_78;
  case 0x11:
  case 0x15:
    re->start_bitmap[1] = re->start_bitmap[1] | 0x3c;
    if (utf == 0) {
      re->start_bitmap[0x10] = re->start_bitmap[0x10] | 0x20;
      iVar7 = local_34;
    }
    else {
      re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
      re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
      iVar7 = local_34;
    }
    goto switchD_0012ecf0_caseD_78;
  case 0x13:
    re->start_bitmap[1] = re->start_bitmap[1] | 2;
    re->start_bitmap[4] = re->start_bitmap[4] | 1;
    if (utf == 0) {
      re->start_bitmap[0x14] = re->start_bitmap[0x14] | 1;
      iVar7 = local_34;
    }
    else {
      re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
      re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 0xe;
      iVar7 = local_34;
    }
    goto switchD_0012ecf0_caseD_78;
  case 0x1d:
  case 0x23:
  case 0x24:
  case 0x2b:
    goto switchD_0012ecf0_caseD_1d;
  case 0x1e:
  case 0x30:
  case 0x31:
  case 0x38:
    goto switchD_0012ecf0_caseD_1e;
  case 0x21:
  case 0x22:
  case 0x25:
  case 0x26:
  case 0x2a:
  case 0x2c:
    pbVar15 = pbVar15 + 1;
    goto LAB_0012edeb;
  case 0x27:
  case 0x28:
  case 0x2d:
    pbVar15 = pbVar15 + 3;
LAB_0012edeb:
    BVar13 = 0;
LAB_0012ee04:
    pbVar15 = set_table_bit(re,pbVar15,BVar13,utf);
    goto LAB_0012ecd2;
  case 0x29:
    pbVar15 = pbVar15 + 2;
switchD_0012ecf0_caseD_1d:
    BVar13 = 0;
LAB_0012f1a8:
    set_table_bit(re,pbVar15 + 1,BVar13,utf);
    iVar7 = local_34;
    goto switchD_0012ecf0_caseD_78;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x37:
  case 0x39:
    pbVar15 = pbVar15 + 1;
    goto LAB_0012edf9;
  case 0x34:
  case 0x35:
  case 0x3a:
    pbVar15 = pbVar15 + 3;
LAB_0012edf9:
    BVar13 = 1;
    goto LAB_0012ee04;
  case 0x36:
    pbVar15 = pbVar15 + 2;
switchD_0012ecf0_caseD_1e:
    BVar13 = 1;
    goto LAB_0012f1a8;
  case 0x55:
  case 0x56:
  case 0x59:
  case 0x5a:
  case 0x5e:
  case 0x60:
    goto switchD_0012ecf0_caseD_55;
  case 0x5b:
  case 0x5c:
  case 0x61:
    pbVar15 = pbVar15 + 2;
switchD_0012ecf0_caseD_55:
    iVar7 = 0;
    switch(pbVar15[1]) {
    case 6:
      puVar3 = re->tables;
      uVar12 = 0;
      do {
        re->start_bitmap[uVar12] = re->start_bitmap[uVar12] | ~puVar3[uVar12 + 0x240];
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
      break;
    case 7:
      iVar7 = 0x40;
      goto LAB_0012efa5;
    case 8:
      puVar3 = re->tables;
      uVar12 = 0;
      do {
        re->start_bitmap[uVar12] = re->start_bitmap[uVar12] | ~puVar3[uVar12 + 0x200];
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
      break;
    case 9:
      iVar7 = 0;
      goto LAB_0012efa5;
    case 10:
      puVar3 = re->tables;
      uVar12 = 0;
      do {
        re->start_bitmap[uVar12] = re->start_bitmap[uVar12] | ~puVar3[uVar12 + 0x2a0];
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
      break;
    case 0xb:
      iVar7 = 0xa0;
LAB_0012efa5:
      set_type_bits(re,iVar7,table_limit);
      goto LAB_0012f03a;
    default:
      goto switchD_0012ecf0_caseD_79;
    case 0x11:
    case 0x15:
      re->start_bitmap[1] = re->start_bitmap[1] | 0x3c;
      if (utf == 0) {
        re->start_bitmap[0x10] = re->start_bitmap[0x10] | 0x20;
      }
      else {
        re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
        re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 4;
      }
      goto LAB_0012f03a;
    case 0x13:
      re->start_bitmap[1] = re->start_bitmap[1] | 2;
      re->start_bitmap[4] = re->start_bitmap[4] | 1;
      if (utf == 0) {
        re->start_bitmap[0x14] = re->start_bitmap[0x14] | 1;
      }
      else {
        re->start_bitmap[0x18] = re->start_bitmap[0x18] | 4;
        re->start_bitmap[0x1c] = re->start_bitmap[0x1c] | 0xe;
      }
      goto LAB_0012f03a;
    }
    if (utf != 0) {
      re->start_bitmap[0x18] = 0xff;
      re->start_bitmap[0x19] = 0xff;
      re->start_bitmap[0x1a] = 0xff;
      re->start_bitmap[0x1b] = 0xff;
      re->start_bitmap[0x1c] = 0xff;
      re->start_bitmap[0x1d] = 0xff;
      re->start_bitmap[0x1e] = 0xff;
      re->start_bitmap[0x1f] = 0xff;
    }
LAB_0012f03a:
    pbVar15 = pbVar15 + 2;
    goto LAB_0012ecd2;
  case 0x5d:
    break;
  default:
    return 3;
  case 0x6e:
    goto switchD_0012ecf0_caseD_6e;
  case 0x6f:
    pbVar9 = (byte *)0x0;
    goto LAB_0012ee8e;
  case 0x70:
    bVar2 = pbVar15[3];
    if ((bVar2 & 4) != 0) {
      return 0;
    }
    if ((bVar2 & 3) == 1) {
      return 0;
    }
    pbVar9 = (byte *)0x0;
    if ((bVar2 & 2) != 0) {
      pbVar9 = pbVar15 + 4;
    }
LAB_0012ee8e:
    if (utf != 0) {
      re->start_bitmap[0x18] = re->start_bitmap[0x18] | 0xf0;
      re->start_bitmap[0x1c] = 0xff;
      re->start_bitmap[0x1d] = 0xff;
      re->start_bitmap[0x1e] = 0xff;
      re->start_bitmap[0x1f] = 0xff;
      re->start_bitmap[0x19] = 0xff;
      re->start_bitmap[0x1a] = 0xff;
      re->start_bitmap[0x1b] = 0xff;
      re->start_bitmap[0x1c] = 0xff;
      bVar10 = *pbVar15;
    }
    if (bVar10 == 0x70) {
      pbVar15 = pbVar15 + (ushort)(*(ushort *)(pbVar15 + 1) << 8 | *(ushort *)(pbVar15 + 1) >> 8);
      if (pbVar9 != (byte *)0x0) goto LAB_0012eecc;
    }
    else {
switchD_0012ecf0_caseD_6e:
      pbVar9 = pbVar15 + 1;
      pbVar15 = pbVar15 + 0x21;
LAB_0012eecc:
      lVar11 = 0;
      if (utf == 0) {
        do {
          re->start_bitmap[lVar11] = re->start_bitmap[lVar11] | pbVar9[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x20);
      }
      else {
        do {
          re->start_bitmap[lVar11] = re->start_bitmap[lVar11] | pbVar9[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
        uVar8 = 0x80;
        do {
          uVar14 = uVar8;
          if (pbVar9[uVar8 >> 3] != 0) {
            re->start_bitmap[0x18] =
                 re->start_bitmap[0x18] | (byte)(1 << ((byte)(uVar8 >> 6) & 0x1f));
            uVar14 = uVar8 | 0x3f;
          }
          uVar8 = uVar14 + 1;
        } while (uVar14 < 0xff);
      }
    }
    uVar8 = *pbVar15 - 0x62;
    iVar7 = local_34;
    if (0xb < uVar8) goto switchD_0012ecf0_caseD_78;
    if ((0x533U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_0012effa;
switchD_0012ecf0_caseD_4:
    pbVar15 = pbVar15 + 1;
    goto LAB_0012ecd2;
  case 0x76:
    pbVar15 = pbVar15 + 6;
    goto LAB_0012ecd2;
  case 0x77:
    pbVar15 = pbVar15 + (ushort)(*(ushort *)(pbVar15 + 5) << 8 | *(ushort *)(pbVar15 + 5) >> 8);
    goto LAB_0012ecd2;
  case 0x78:
    goto switchD_0012ecf0_caseD_78;
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
    goto switchD_0012ecf0_caseD_79;
  case 0x7e:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
    iVar6 = set_start_bits(re,pbVar15,utf);
    if (iVar6 == 0) {
      return 0;
    }
    iVar7 = local_34;
    if (iVar6 == 1) goto switchD_0012ecf0_caseD_78;
    if (iVar6 == 3) {
      return 3;
    }
    do {
      uVar5 = *(ushort *)(pbVar15 + 1) << 8 | *(ushort *)(pbVar15 + 1) >> 8;
      pbVar9 = pbVar15 + uVar5;
      pbVar15 = pbVar15 + uVar5;
    } while (*pbVar9 == 0x78);
    break;
  case 0x7f:
  case 0x80:
  case 0x81:
    do {
      uVar5 = *(ushort *)(pbVar15 + 1) << 8 | *(ushort *)(pbVar15 + 1) >> 8;
      pbVar9 = pbVar15 + uVar5;
      pbVar15 = pbVar15 + uVar5;
    } while (*pbVar9 == 0x78);
    break;
  case 0x94:
  case 0x95:
  case 0x96:
    pbVar15 = pbVar15 + 1;
    iVar7 = set_start_bits(re,pbVar15,utf);
    if (iVar7 == 0) {
      return 0;
    }
    if (iVar7 == 3) {
      return 3;
    }
    do {
      uVar5 = *(ushort *)(pbVar15 + 1) << 8 | *(ushort *)(pbVar15 + 1) >> 8;
      pbVar9 = pbVar15 + uVar5;
      pbVar15 = pbVar15 + uVar5;
    } while (*pbVar9 == 0x78);
    break;
  case 0xa3:
    pbVar15 = pbVar15 + 1;
    do {
      uVar5 = *(ushort *)(pbVar15 + 1) << 8 | *(ushort *)(pbVar15 + 1) >> 8;
      pbVar9 = pbVar15 + uVar5;
      pbVar15 = pbVar15 + uVar5;
    } while (*pbVar9 == 0x78);
  }
  pbVar15 = pbVar15 + 3;
  goto LAB_0012ecd2;
LAB_0012effa:
  if (((0x8c0U >> (uVar8 & 0x1f) & 1) == 0) ||
     (sVar4 = *(ushort *)(pbVar15 + 1) << 8, uVar5 = *(ushort *)(pbVar15 + 1) >> 8,
     pbVar15 = pbVar15 + (ulong)(sVar4 == 0 && uVar5 == 0) * 5, sVar4 != 0 || uVar5 != 0))
  goto switchD_0012ecf0_caseD_78;
  goto LAB_0012ecd2;
LAB_0012f0ab:
  do {
    puVar16 = puVar16 + 1;
    if (utf == 0) {
      if (cvalue < 0x100) goto LAB_0012f0d0;
      re->start_bitmap[0x1f] = re->start_bitmap[0x1f] | 0x80;
    }
    else {
      _pcre2_ord2utf_8(cvalue,local_46);
      cvalue = (uint32_t)local_46[0];
LAB_0012f0d0:
      re->start_bitmap[cvalue >> 3] =
           re->start_bitmap[cvalue >> 3] | (byte)(1 << ((byte)cvalue & 7));
    }
    cvalue = *puVar16;
  } while (cvalue != 0xffffffff);
switchD_0012ecf0_caseD_78:
  uVar5 = *(ushort *)(pPStack_40 + 1) << 8 | *(ushort *)(pPStack_40 + 1) >> 8;
  pPVar1 = pPStack_40 + uVar5;
  pPStack_40 = pPStack_40 + uVar5;
  bVar10 = 0x78;
  local_34 = iVar7;
  if (*pPVar1 != 'x') {
switchD_0012ecf0_caseD_79:
    return iVar7;
  }
  goto LAB_0012ecab;
}

Assistant:

static int
set_start_bits(pcre2_real_code *re, PCRE2_SPTR code, BOOL utf)
{
register uint32_t c;
int yield = SSB_DONE;

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
int table_limit = utf? 16:32;
#else
int table_limit = 32;
#endif

do
  {
  BOOL try_next = TRUE;
  PCRE2_SPTR tcode = code + 1 + LINK_SIZE;

  if (*code == OP_CBRA || *code == OP_SCBRA ||
      *code == OP_CBRAPOS || *code == OP_SCBRAPOS) tcode += IMM2_SIZE;

  while (try_next)    /* Loop for items in this branch */
    {
    int rc;
    uint8_t *classmap = NULL;

    switch(*tcode)
      {
      /* If we reach something we don't understand, it means a new opcode has
      been created that hasn't been added to this function. Hopefully this
      problem will be discovered during testing. */

      default:
      return SSB_UNKNOWN;

      /* Fail for a valid opcode that implies no starting bits. */

      case OP_ACCEPT:
      case OP_ASSERT_ACCEPT:
      case OP_ALLANY:
      case OP_ANY:
      case OP_ANYBYTE:
      case OP_CIRC:
      case OP_CIRCM:
      case OP_CLOSE:
      case OP_COMMIT:
      case OP_COND:
      case OP_CREF:
      case OP_FALSE:
      case OP_TRUE:
      case OP_DNCREF:
      case OP_DNREF:
      case OP_DNREFI:
      case OP_DNRREF:
      case OP_DOLL:
      case OP_DOLLM:
      case OP_END:
      case OP_EOD:
      case OP_EODN:
      case OP_EXTUNI:
      case OP_FAIL:
      case OP_MARK:
      case OP_NOT:
      case OP_NOTEXACT:
      case OP_NOTEXACTI:
      case OP_NOTI:
      case OP_NOTMINPLUS:
      case OP_NOTMINPLUSI:
      case OP_NOTMINQUERY:
      case OP_NOTMINQUERYI:
      case OP_NOTMINSTAR:
      case OP_NOTMINSTARI:
      case OP_NOTMINUPTO:
      case OP_NOTMINUPTOI:
      case OP_NOTPLUS:
      case OP_NOTPLUSI:
      case OP_NOTPOSPLUS:
      case OP_NOTPOSPLUSI:
      case OP_NOTPOSQUERY:
      case OP_NOTPOSQUERYI:
      case OP_NOTPOSSTAR:
      case OP_NOTPOSSTARI:
      case OP_NOTPOSUPTO:
      case OP_NOTPOSUPTOI:
      case OP_NOTPROP:
      case OP_NOTQUERY:
      case OP_NOTQUERYI:
      case OP_NOTSTAR:
      case OP_NOTSTARI:
      case OP_NOTUPTO:
      case OP_NOTUPTOI:
      case OP_NOT_HSPACE:
      case OP_NOT_VSPACE:
      case OP_PRUNE:
      case OP_PRUNE_ARG:
      case OP_RECURSE:
      case OP_REF:
      case OP_REFI:
      case OP_REVERSE:
      case OP_RREF:
      case OP_SCOND:
      case OP_SET_SOM:
      case OP_SKIP:
      case OP_SKIP_ARG:
      case OP_SOD:
      case OP_SOM:
      case OP_THEN:
      case OP_THEN_ARG:
      return SSB_FAIL;

      /* A "real" property test implies no starting bits, but the fake property
      PT_CLIST identifies a list of characters. These lists are short, as they
      are used for characters with more than one "other case", so there is no
      point in recognizing them for OP_NOTPROP. */

      case OP_PROP:
      if (tcode[1] != PT_CLIST) return SSB_FAIL;
        {
        const uint32_t *p = PRIV(ucd_caseless_sets) + tcode[2];
        while ((c = *p++) < NOTACHAR)
          {
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
          if (utf)
            {
            PCRE2_UCHAR buff[6];
            (void)PRIV(ord2utf)(c, buff);
            c = buff[0];
            }
#endif
          if (c > 0xff) SET_BIT(0xff); else SET_BIT(c);
          }
        }
      try_next = FALSE;
      break;

      /* We can ignore word boundary tests. */

      case OP_WORD_BOUNDARY:
      case OP_NOT_WORD_BOUNDARY:
      tcode++;
      break;

      /* If we hit a bracket or a positive lookahead assertion, recurse to set
      bits from within the subpattern. If it can't find anything, we have to
      give up. If it finds some mandatory character(s), we are done for this
      branch. Otherwise, carry on scanning after the subpattern. */

      case OP_BRA:
      case OP_SBRA:
      case OP_CBRA:
      case OP_SCBRA:
      case OP_BRAPOS:
      case OP_SBRAPOS:
      case OP_CBRAPOS:
      case OP_SCBRAPOS:
      case OP_ONCE:
      case OP_ONCE_NC:
      case OP_ASSERT:
      rc = set_start_bits(re, tcode, utf);
      if (rc == SSB_FAIL || rc == SSB_UNKNOWN) return rc;
      if (rc == SSB_DONE) try_next = FALSE; else
        {
        do tcode += GET(tcode, 1); while (*tcode == OP_ALT);
        tcode += 1 + LINK_SIZE;
        }
      break;

      /* If we hit ALT or KET, it means we haven't found anything mandatory in
      this branch, though we might have found something optional. For ALT, we
      continue with the next alternative, but we have to arrange that the final
      result from subpattern is SSB_CONTINUE rather than SSB_DONE. For KET,
      return SSB_CONTINUE: if this is the top level, that indicates failure,
      but after a nested subpattern, it causes scanning to continue. */

      case OP_ALT:
      yield = SSB_CONTINUE;
      try_next = FALSE;
      break;

      case OP_KET:
      case OP_KETRMAX:
      case OP_KETRMIN:
      case OP_KETRPOS:
      return SSB_CONTINUE;

      /* Skip over callout */

      case OP_CALLOUT:
      tcode += PRIV(OP_lengths)[OP_CALLOUT];
      break;

      case OP_CALLOUT_STR:
      tcode += GET(tcode, 1 + 2*LINK_SIZE);
      break;

      /* Skip over lookbehind and negative lookahead assertions */

      case OP_ASSERT_NOT:
      case OP_ASSERTBACK:
      case OP_ASSERTBACK_NOT:
      do tcode += GET(tcode, 1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* BRAZERO does the bracket, but carries on. */

      case OP_BRAZERO:
      case OP_BRAMINZERO:
      case OP_BRAPOSZERO:
      rc = set_start_bits(re, ++tcode, utf);
      if (rc == SSB_FAIL || rc == SSB_UNKNOWN) return rc;
      do tcode += GET(tcode,1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* SKIPZERO skips the bracket. */

      case OP_SKIPZERO:
      tcode++;
      do tcode += GET(tcode,1); while (*tcode == OP_ALT);
      tcode += 1 + LINK_SIZE;
      break;

      /* Single-char * or ? sets the bit and tries the next item */

      case OP_STAR:
      case OP_MINSTAR:
      case OP_POSSTAR:
      case OP_QUERY:
      case OP_MINQUERY:
      case OP_POSQUERY:
      tcode = set_table_bit(re, tcode + 1, FALSE, utf);
      break;

      case OP_STARI:
      case OP_MINSTARI:
      case OP_POSSTARI:
      case OP_QUERYI:
      case OP_MINQUERYI:
      case OP_POSQUERYI:
      tcode = set_table_bit(re, tcode + 1, TRUE, utf);
      break;

      /* Single-char upto sets the bit and tries the next */

      case OP_UPTO:
      case OP_MINUPTO:
      case OP_POSUPTO:
      tcode = set_table_bit(re, tcode + 1 + IMM2_SIZE, FALSE, utf);
      break;

      case OP_UPTOI:
      case OP_MINUPTOI:
      case OP_POSUPTOI:
      tcode = set_table_bit(re, tcode + 1 + IMM2_SIZE, TRUE, utf);
      break;

      /* At least one single char sets the bit and stops */

      case OP_EXACT:
      tcode += IMM2_SIZE;
      /* Fall through */
      case OP_CHAR:
      case OP_PLUS:
      case OP_MINPLUS:
      case OP_POSPLUS:
      (void)set_table_bit(re, tcode + 1, FALSE, utf);
      try_next = FALSE;
      break;

      case OP_EXACTI:
      tcode += IMM2_SIZE;
      /* Fall through */
      case OP_CHARI:
      case OP_PLUSI:
      case OP_MINPLUSI:
      case OP_POSPLUSI:
      (void)set_table_bit(re, tcode + 1, TRUE, utf);
      try_next = FALSE;
      break;

      /* Special spacing and line-terminating items. These recognize specific
      lists of characters. The difference between VSPACE and ANYNL is that the
      latter can match the two-character CRLF sequence, but that is not
      relevant for finding the first character, so their code here is
      identical. */

      case OP_HSPACE:
      SET_BIT(CHAR_HT);
      SET_BIT(CHAR_SPACE);

      /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
      the bits for 0xA0 and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(0xA0);
      SET_BIT(0xFF);
#else
      /* For the 8-bit library in UTF-8 mode, set the bits for the first code
      units of horizontal space characters. */

#ifdef SUPPORT_UNICODE
      if (utf)
        {
        SET_BIT(0xC2);  /* For U+00A0 */
        SET_BIT(0xE1);  /* For U+1680, U+180E */
        SET_BIT(0xE2);  /* For U+2000 - U+200A, U+202F, U+205F */
        SET_BIT(0xE3);  /* For U+3000 */
        }
      else
#endif
      /* For the 8-bit library not in UTF-8 mode, set the bit for 0xA0, unless
      the code is EBCDIC. */
        {
#ifndef EBCDIC
        SET_BIT(0xA0);
#endif  /* Not EBCDIC */
        }
#endif  /* 8-bit support */

      try_next = FALSE;
      break;

      case OP_ANYNL:
      case OP_VSPACE:
      SET_BIT(CHAR_LF);
      SET_BIT(CHAR_VT);
      SET_BIT(CHAR_FF);
      SET_BIT(CHAR_CR);

      /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
      the bits for NEL and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(CHAR_NEL);
      SET_BIT(0xFF);
#else
      /* For the 8-bit library in UTF-8 mode, set the bits for the first code
      units of vertical space characters. */

#ifdef SUPPORT_UNICODE
      if (utf)
        {
        SET_BIT(0xC2);  /* For U+0085 (NEL) */
        SET_BIT(0xE2);  /* For U+2028, U+2029 */
        }
      else
#endif
      /* For the 8-bit library not in UTF-8 mode, set the bit for NEL. */
        {
        SET_BIT(CHAR_NEL);
        }
#endif  /* 8-bit support */

      try_next = FALSE;
      break;

      /* Single character types set the bits and stop. Note that if PCRE2_UCP
      is set, we do not see these op codes because \d etc are converted to
      properties. Therefore, these apply in the case when only characters less
      than 256 are recognized to match the types. */

      case OP_NOT_DIGIT:
      set_nottype_bits(re, cbit_digit, table_limit);
      try_next = FALSE;
      break;

      case OP_DIGIT:
      set_type_bits(re, cbit_digit, table_limit);
      try_next = FALSE;
      break;

      case OP_NOT_WHITESPACE:
      set_nottype_bits(re, cbit_space, table_limit);
      try_next = FALSE;
      break;

      case OP_WHITESPACE:
      set_type_bits(re, cbit_space, table_limit);
      try_next = FALSE;
      break;

      case OP_NOT_WORDCHAR:
      set_nottype_bits(re, cbit_word, table_limit);
      try_next = FALSE;
      break;

      case OP_WORDCHAR:
      set_type_bits(re, cbit_word, table_limit);
      try_next = FALSE;
      break;

      /* One or more character type fudges the pointer and restarts, knowing
      it will hit a single character type and stop there. */

      case OP_TYPEPLUS:
      case OP_TYPEMINPLUS:
      case OP_TYPEPOSPLUS:
      tcode++;
      break;

      case OP_TYPEEXACT:
      tcode += 1 + IMM2_SIZE;
      break;

      /* Zero or more repeats of character types set the bits and then
      try again. */

      case OP_TYPEUPTO:
      case OP_TYPEMINUPTO:
      case OP_TYPEPOSUPTO:
      tcode += IMM2_SIZE;  /* Fall through */

      case OP_TYPESTAR:
      case OP_TYPEMINSTAR:
      case OP_TYPEPOSSTAR:
      case OP_TYPEQUERY:
      case OP_TYPEMINQUERY:
      case OP_TYPEPOSQUERY:
      switch(tcode[1])
        {
        default:
        case OP_ANY:
        case OP_ALLANY:
        return SSB_FAIL;

        case OP_HSPACE:
        SET_BIT(CHAR_HT);
        SET_BIT(CHAR_SPACE);

        /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
        the bits for 0xA0 and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        SET_BIT(0xA0);
        SET_BIT(0xFF);
#else
        /* For the 8-bit library in UTF-8 mode, set the bits for the first code
        units of horizontal space characters. */

#ifdef SUPPORT_UNICODE
        if (utf)
          {
          SET_BIT(0xC2);  /* For U+00A0 */
          SET_BIT(0xE1);  /* For U+1680, U+180E */
          SET_BIT(0xE2);  /* For U+2000 - U+200A, U+202F, U+205F */
          SET_BIT(0xE3);  /* For U+3000 */
          }
        else
#endif
        /* For the 8-bit library not in UTF-8 mode, set the bit for 0xA0, unless
        the code is EBCDIC. */
          {
#ifndef EBCDIC
          SET_BIT(0xA0);
#endif  /* Not EBCDIC */
          }
#endif  /* 8-bit support */
        break;

        case OP_ANYNL:
        case OP_VSPACE:
        SET_BIT(CHAR_LF);
        SET_BIT(CHAR_VT);
        SET_BIT(CHAR_FF);
        SET_BIT(CHAR_CR);

        /* For the 16-bit and 32-bit libraries (which can never be EBCDIC), set
        the bits for NEL and for code units >= 255, independently of UTF. */

#if PCRE2_CODE_UNIT_WIDTH != 8
        SET_BIT(CHAR_NEL);
        SET_BIT(0xFF);
#else
        /* For the 8-bit library in UTF-8 mode, set the bits for the first code
        units of vertical space characters. */

#ifdef SUPPORT_UNICODE
        if (utf)
          {
          SET_BIT(0xC2);  /* For U+0085 (NEL) */
          SET_BIT(0xE2);  /* For U+2028, U+2029 */
          }
        else
#endif
        /* For the 8-bit library not in UTF-8 mode, set the bit for NEL. */
          {
          SET_BIT(CHAR_NEL);
          }
#endif  /* 8-bit support */
        break;

        case OP_NOT_DIGIT:
        set_nottype_bits(re, cbit_digit, table_limit);
        break;

        case OP_DIGIT:
        set_type_bits(re, cbit_digit, table_limit);
        break;

        case OP_NOT_WHITESPACE:
        set_nottype_bits(re, cbit_space, table_limit);
        break;

        case OP_WHITESPACE:
        set_type_bits(re, cbit_space, table_limit);
        break;

        case OP_NOT_WORDCHAR:
        set_nottype_bits(re, cbit_word, table_limit);
        break;

        case OP_WORDCHAR:
        set_type_bits(re, cbit_word, table_limit);
        break;
        }

      tcode += 2;
      break;

      /* Extended class: if there are any property checks, or if this is a
      negative XCLASS without a map, give up. If there are no property checks,
      there must be wide characters on the XCLASS list, because otherwise an
      XCLASS would not have been created. This means that code points >= 255
      are always potential starters. */

#ifdef SUPPORT_WIDE_CHARS
      case OP_XCLASS:
      if ((tcode[1 + LINK_SIZE] & XCL_HASPROP) != 0 ||
          (tcode[1 + LINK_SIZE] & (XCL_MAP|XCL_NOT)) == XCL_NOT)
        return SSB_FAIL;

      /* We have a positive XCLASS or a negative one without a map. Set up the
      map pointer if there is one, and fall through. */

      classmap = ((tcode[1 + LINK_SIZE] & XCL_MAP) == 0)? NULL :
        (uint8_t *)(tcode + 1 + LINK_SIZE + 1);
#endif

      /* Enter here for a negative non-XCLASS. In the 8-bit library, if we are
      in UTF mode, any byte with a value >= 0xc4 is a potentially valid starter
      because it starts a character with a value > 255. In 8-bit non-UTF mode,
      there is no difference between CLASS and NCLASS. In all other wide
      character modes, set the 0xFF bit to indicate code units >= 255. */

      case OP_NCLASS:
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
      if (utf)
        {
        re->start_bitmap[24] |= 0xf0;            /* Bits for 0xc4 - 0xc8 */
        memset(re->start_bitmap+25, 0xff, 7);    /* Bits for 0xc9 - 0xff */
        }
#elif PCRE2_CODE_UNIT_WIDTH != 8
      SET_BIT(0xFF);                             /* For characters >= 255 */
#endif
      /* Fall through */

      /* Enter here for a positive non-XCLASS. If we have fallen through from
      an XCLASS, classmap will already be set; just advance the code pointer.
      Otherwise, set up classmap for a a non-XCLASS and advance past it. */

      case OP_CLASS:
      if (*tcode == OP_XCLASS) tcode += GET(tcode, 1); else
        {
        classmap = (uint8_t *)(++tcode);
        tcode += 32 / sizeof(PCRE2_UCHAR);
        }

      /* When wide characters are supported, classmap may be NULL. In UTF-8
      (sic) mode, the bits in a class bit map correspond to character values,
      not to byte values. However, the bit map we are constructing is for byte
      values. So we have to do a conversion for characters whose code point is
      greater than 127. In fact, there are only two possible starting bytes for
      characters in the range 128 - 255. */

      if (classmap != NULL)
        {
#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH == 8
        if (utf)
          {
          for (c = 0; c < 16; c++) re->start_bitmap[c] |= classmap[c];
          for (c = 128; c < 256; c++)
            {
            if ((classmap[c/8] && (1 << (c&7))) != 0)
              {
              int d = (c >> 6) | 0xc0;            /* Set bit for this starter */
              re->start_bitmap[d/8] |= (1 << (d&7));  /* and then skip on to the */
              c = (c & 0xc0) + 0x40 - 1;          /* next relevant character. */
              }
            }
          }
        else
#endif
        /* In all modes except UTF-8, the two bit maps are compatible. */

          {
          for (c = 0; c < 32; c++) re->start_bitmap[c] |= classmap[c];
          }
        }

      /* Act on what follows the class. For a zero minimum repeat, continue;
      otherwise stop processing. */

      switch (*tcode)
        {
        case OP_CRSTAR:
        case OP_CRMINSTAR:
        case OP_CRQUERY:
        case OP_CRMINQUERY:
        case OP_CRPOSSTAR:
        case OP_CRPOSQUERY:
        tcode++;
        break;

        case OP_CRRANGE:
        case OP_CRMINRANGE:
        case OP_CRPOSRANGE:
        if (GET2(tcode, 1) == 0) tcode += 1 + 2 * IMM2_SIZE;
          else try_next = FALSE;
        break;

        default:
        try_next = FALSE;
        break;
        }
      break; /* End of class handling case */
      }      /* End of switch for opcodes */
    }        /* End of try_next loop */

  code += GET(code, 1);   /* Advance to next branch */
  }
while (*code == OP_ALT);

return yield;
}